

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O1

string * __thiscall
flow::diagnostics::Message::string_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  Message *local_268;
  code *local_260;
  Message *local_258;
  code *pcStack_250;
  pointer local_248;
  size_type sStack_240;
  undefined **local_230;
  undefined1 *local_228;
  long lStack_220;
  ulong local_218;
  undefined1 local_210 [504];
  
  if (this->type == LinkError) {
    local_260 = fmt::v5::internal::
                value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                ::format_custom_arg<flow::diagnostics::Type>;
    local_258 = (Message *)(this->text)._M_dataplus._M_p;
    pcStack_250 = (code *)(this->text)._M_string_length;
    local_228 = local_210;
    lStack_220 = 0;
    local_230 = &PTR_grow_001aeda8;
    local_218 = 500;
    format_str_00.size_ = 6;
    format_str_00.data_ = "{}: {}";
    args_00.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_268;
    args_00.types_ = 0xbd;
    local_268 = this;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_230,format_str_00,args_00);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_228,local_228 + lStack_220);
  }
  else if (this->type == Warning) {
    local_268 = (Message *)&this->sourceLocation;
    local_260 = fmt::v5::internal::
                value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                ::format_custom_arg<flow::SourceLocation>;
    local_258 = (Message *)(this->text)._M_dataplus._M_p;
    pcStack_250 = (code *)(this->text)._M_string_length;
    local_228 = local_210;
    lStack_220 = 0;
    local_230 = &PTR_grow_001aeda8;
    local_218 = 500;
    format_str.size_ = 7;
    format_str.data_ = "[{}] {}";
    args.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_268;
    args.types_ = 0xbd;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_230,format_str,args);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_228,local_228 + lStack_220);
  }
  else {
    local_268 = (Message *)&this->sourceLocation;
    local_260 = fmt::v5::internal::
                value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                ::format_custom_arg<flow::SourceLocation>;
    pcStack_250 = fmt::v5::internal::
                  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  ::format_custom_arg<flow::diagnostics::Type>;
    local_248 = (this->text)._M_dataplus._M_p;
    sStack_240 = (this->text)._M_string_length;
    local_228 = local_210;
    lStack_220 = 0;
    local_230 = &PTR_grow_001aeda8;
    local_218 = 500;
    format_str_01.size_ = 0xb;
    format_str_01.data_ = "[{}] {}: {}";
    args_01.field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_268;
    args_01.types_ = 0xbdd;
    local_258 = this;
    fmt::v5::
    vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ((range)&local_230,format_str_01,args_01);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_228,local_228 + lStack_220);
  }
  local_230 = &PTR_grow_001aeda8;
  if (local_228 != local_210) {
    operator_delete(local_228,local_218);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Message::string() const {
  switch (type) {
    case Type::Warning:
      return fmt::format("[{}] {}", sourceLocation, text);
    case Type::LinkError:
      return fmt::format("{}: {}", type, text);
    default:
      return fmt::format("[{}] {}: {}", sourceLocation, type, text);
  }
}